

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_hashtable.cpp
# Opt level: O1

void __thiscall
duckdb::JoinHashTable::Probe
          (JoinHashTable *this,ScanStructure *scan_structure,DataChunk *keys,
          TupleDataChunkState *key_state,ProbeState *probe_state,
          optional_ptr<duckdb::Vector,_true> precomputed_hashes)

{
  idx_t *count;
  SelectionVector *current_sel;
  optional_ptr<duckdb::Vector,_true> precomputed_hashes_local;
  LogicalType local_b0;
  Vector hashes;
  
  precomputed_hashes_local = precomputed_hashes;
  InitializeScanStructure(this,scan_structure,keys,key_state,&current_sel);
  if (scan_structure->count != 0) {
    count = &scan_structure->count;
    if (precomputed_hashes_local.ptr == (Vector *)0x0) {
      LogicalType::LogicalType(&local_b0,UBIGINT);
      Vector::Vector(&hashes,&local_b0,0x800);
      LogicalType::~LogicalType(&local_b0);
      Hash(this,keys,current_sel,*count,&hashes);
      GetRowPointers(this,keys,key_state,probe_state,&hashes,current_sel,count,
                     &scan_structure->pointers,&scan_structure->sel_vector);
      if (hashes.auxiliary.internal.
          super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (hashes.auxiliary.internal.
                   super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (hashes.buffer.internal.
          super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (hashes.buffer.internal.
                   super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (hashes.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (hashes.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                   .
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      LogicalType::~LogicalType(&hashes.type);
    }
    else {
      optional_ptr<duckdb::Vector,_true>::CheckValid(&precomputed_hashes_local);
      GetRowPointers(this,keys,key_state,probe_state,precomputed_hashes_local.ptr,current_sel,count,
                     &scan_structure->pointers,&scan_structure->sel_vector);
    }
  }
  return;
}

Assistant:

void JoinHashTable::Probe(ScanStructure &scan_structure, DataChunk &keys, TupleDataChunkState &key_state,
                          ProbeState &probe_state, optional_ptr<Vector> precomputed_hashes) {
	const SelectionVector *current_sel;
	InitializeScanStructure(scan_structure, keys, key_state, current_sel);
	if (scan_structure.count == 0) {
		return;
	}

	if (precomputed_hashes) {
		GetRowPointers(keys, key_state, probe_state, *precomputed_hashes, *current_sel, scan_structure.count,
		               scan_structure.pointers, scan_structure.sel_vector);
	} else {
		Vector hashes(LogicalType::HASH);
		// hash all the keys
		Hash(keys, *current_sel, scan_structure.count, hashes);

		// now initialize the pointers of the scan structure based on the hashes
		GetRowPointers(keys, key_state, probe_state, hashes, *current_sel, scan_structure.count,
		               scan_structure.pointers, scan_structure.sel_vector);
	}
}